

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ConcatenationExpression::visitExprs<LookupIdentifier&>
          (ConcatenationExpression *this,LookupIdentifier *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  ppEVar1 = (this->operands_)._M_ptr;
  sVar2 = (this->operands_)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<LookupIdentifier&>(*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto op : operands())
            op->visit(visitor);
    }